

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSemi.c
# Opt level: O0

int Ssw_SemCheckTargets(Ssw_Sem_t *p)

{
  int iVar1;
  Aig_Obj_t *pObj_00;
  int local_24;
  int i;
  Aig_Obj_t *pObj;
  Ssw_Sem_t *p_local;
  
  local_24 = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(p->vTargets);
    if (iVar1 <= local_24) {
      return 0;
    }
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p->vTargets,local_24);
    iVar1 = Ssw_ObjIsConst1Cand(p->pMan->pAig,pObj_00);
    if (iVar1 == 0) break;
    local_24 = local_24 + 1;
  }
  return 1;
}

Assistant:

int Ssw_SemCheckTargets( Ssw_Sem_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vTargets, pObj, i )
        if ( !Ssw_ObjIsConst1Cand(p->pMan->pAig, pObj) )
            return 1;
    return 0;
}